

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Vector<float,_4> __thiscall tcu::operator*(tcu *this,Matrix<float,_4,_4> *mtx,Vector<float,_4> *vec)

{
  int row;
  long lVar1;
  long lVar2;
  float v;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  float fVar4;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar5;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    uVar3 = 0;
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      fVar4 = *(float *)((long)mtx + lVar2 * 4) * *(float *)((long)vec->m_data + lVar2);
      in_XMM1_Qa = (ulong)(uint)fVar4;
      uVar3 = (ulong)(uint)((float)uVar3 + fVar4);
    }
    *(float *)(this + lVar1 * 4) = (float)uVar3;
    mtx = (Matrix<float,_4,_4> *)((long)mtx + 4);
  }
  VVar5.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar5.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar5.m_data[0] = (float)(int)uVar3;
  VVar5.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar5.m_data;
}

Assistant:

Vector<T, Rows> operator* (const Matrix<T, Rows, Cols>& mtx, const Vector<T, Cols>& vec)
{
	Vector<T, Rows> res;
	for (int row = 0; row < Rows; row++)
	{
		T v = T(0);
		for (int col = 0; col < Cols; col++)
			v += mtx(row,col) * vec.m_data[col];
		res.m_data[row] = v;
	}
	return res;
}